

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_0.c
# Opt level: O2

void test_option_0(void)

{
  wchar_t wVar1;
  FILE *pFVar2;
  size_t sVar3;
  
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                  ,L'\x0e',L'\0');
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                      ,L'\x11',"file1",L'Ƥ',L'\xffffffff',"1234567890");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                      ,L'\x12',"file2",L'Ƥ',L'\xffffffff',"1234567890");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                      ,L'\x13',"file3",L'Ƥ',L'\xffffffff',"1234567890");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                      ,L'\x14',"file4",L'Ƥ',L'\xffffffff',"1234567890");
  pFVar2 = fopen("filelist","wb");
  sVar3 = fwrite("file1\n",1,6,pFVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                      ,L'\x18',sVar3,"fwrite(\"file1\\x0a\", 1, 6, filelist)",6,"6",(void *)0x0);
  sVar3 = fwrite("file2\r",1,6,pFVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                      ,L'\x19',sVar3,"fwrite(\"file2\\x0d\", 1, 6, filelist)",6,"6",(void *)0x0);
  sVar3 = fwrite("file3\n\r",1,7,pFVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                      ,L'\x1a',sVar3,"fwrite(\"file3\\x0a\\x0d\", 1, 7, filelist)",7,"7",(void *)0x0
                     );
  sVar3 = fwrite("file4",1,5,pFVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                      ,L'\x1b',sVar3,"fwrite(\"file4\", 1, 5, filelist)",5,"5",(void *)0x0);
  fclose(pFVar2);
  pFVar2 = fopen("filelistNull","wb");
  sVar3 = fwrite("file1",1,6,pFVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                      ,L' ',sVar3,"fwrite(\"file1\\0\", 1, 6, filelist)",6,"6",(void *)0x0);
  sVar3 = fwrite("file2",1,6,pFVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                      ,L'!',sVar3,"fwrite(\"file2\\0\", 1, 6, filelist)",6,"6",(void *)0x0);
  sVar3 = fwrite("file3",1,6,pFVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                      ,L'\"',sVar3,"fwrite(\"file3\\0\", 1, 6, filelist)",6,"6",(void *)0x0);
  sVar3 = fwrite("file4",1,5,pFVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                      ,L'#',sVar3,"fwrite(\"file4\", 1, 5, filelist)",5,"5",(void *)0x0);
  fclose(pFVar2);
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                  ,L'&',L'\x12');
  wVar1 = systemf("%s -o < filelist > archive 2> stderr1.txt",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                      ,L'*',(long)wVar1,"r",0,"0",(void *)0x0);
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                     ,L'-',"copy",L'ǽ');
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                  ,L'.',"copy");
  wVar1 = systemf("%s -i < ../archive > stdout3.txt 2> stderr3.txt",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                      ,L'0',(long)wVar1,"r",0,"0",(void *)0x0);
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                   ,L'3',"file1",L'Ƥ');
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                   ,L'4',"file2",L'Ƥ');
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                   ,L'5',"file3",L'Ƥ');
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                   ,L'6',"file4",L'Ƥ');
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                  ,L'8',"..");
  wVar1 = systemf("%s -o0 < filelistNull > archiveNull 2> stderr2.txt",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                      ,L'<',(long)wVar1,"r",0,"0",(void *)0x0);
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                     ,L'?',"copyNull",L'ǽ');
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                  ,L'@',"copyNull");
  wVar1 = systemf("%s -i < ../archiveNull > stdout4.txt 2> stderr4.txt",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                      ,L'B',(long)wVar1,"r",0,"0",(void *)0x0);
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                   ,L'E',"file1",L'Ƥ');
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                   ,L'F',"file2",L'Ƥ');
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                   ,L'G',"file3",L'Ƥ');
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_0.c"
                   ,L'H',"file4",L'Ƥ');
  return;
}

Assistant:

DEFINE_TEST(test_option_0)
{
	FILE *filelist;
	int r;

	assertUmask(0);

	/* Create a few files. */
	assertMakeFile("file1", 0644, "1234567890");
	assertMakeFile("file2", 0644, "1234567890");
	assertMakeFile("file3", 0644, "1234567890");
	assertMakeFile("file4", 0644, "1234567890");

	/* Create a file list of filenames with varying end-of-line. */
	filelist = fopen("filelist", "wb");
	assertEqualInt(fwrite("file1\x0a", 1, 6, filelist), 6);
	assertEqualInt(fwrite("file2\x0d", 1, 6, filelist), 6);
	assertEqualInt(fwrite("file3\x0a\x0d", 1, 7, filelist), 7);
	assertEqualInt(fwrite("file4", 1, 5, filelist), 5);
	fclose(filelist);

	/* Create a file list of null-delimited names. */
	filelist = fopen("filelistNull", "wb");
	assertEqualInt(fwrite("file1\0", 1, 6, filelist), 6);
	assertEqualInt(fwrite("file2\0", 1, 6, filelist), 6);
	assertEqualInt(fwrite("file3\0", 1, 6, filelist), 6);
	assertEqualInt(fwrite("file4", 1, 5, filelist), 5);
	fclose(filelist);

	assertUmask(022);

	/* Pack up using the file list with text line endings. */
	r = systemf("%s -o < filelist > archive 2> stderr1.txt", testprog);
	assertEqualInt(r, 0);

	/* Extract into a new dir. */
	assertMakeDir("copy", 0775);
	assertChdir("copy");
	r = systemf("%s -i < ../archive > stdout3.txt 2> stderr3.txt", testprog);
	assertEqualInt(r, 0);

	/* Verify the files. */
	assertIsReg("file1", 0644);
	assertIsReg("file2", 0644);
	assertIsReg("file3", 0644);
	assertIsReg("file4", 0644);

	assertChdir("..");

	/* Pack up using the file list with nulls. */
	r = systemf("%s -o0 < filelistNull > archiveNull 2> stderr2.txt", testprog);
	assertEqualInt(r, 0);

	/* Extract into a new dir. */
	assertMakeDir("copyNull", 0775);
	assertChdir("copyNull");
	r = systemf("%s -i < ../archiveNull > stdout4.txt 2> stderr4.txt", testprog);
	assertEqualInt(r, 0);

	/* Verify the files. */
	assertIsReg("file1", 0644);
	assertIsReg("file2", 0644);
	assertIsReg("file3", 0644);
	assertIsReg("file4", 0644);
}